

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O0

void diy::Serialization<std::vector<diy::Bounds<int>,_std::allocator<diy::Bounds<int>_>_>_>::save
               (BinaryBuffer *bb,Vector *v)

{
  Bounds<int> *x;
  const_reference n;
  BinaryBuffer *in_RSI;
  size_t s;
  unsigned_long *in_stack_ffffffffffffffd8;
  BinaryBuffer *in_stack_ffffffffffffffe0;
  
  x = (Bounds<int> *)
      std::vector<diy::Bounds<int>,_std::allocator<diy::Bounds<int>_>_>::size
                ((vector<diy::Bounds<int>,_std::allocator<diy::Bounds<int>_>_> *)in_RSI);
  save<unsigned_long>(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (x != (Bounds<int> *)0x0) {
    n = std::vector<diy::Bounds<int>,_std::allocator<diy::Bounds<int>_>_>::operator[]
                  ((vector<diy::Bounds<int>,_std::allocator<diy::Bounds<int>_>_> *)in_RSI,0);
    std::vector<diy::Bounds<int>,_std::allocator<diy::Bounds<int>_>_>::size
              ((vector<diy::Bounds<int>,_std::allocator<diy::Bounds<int>_>_> *)in_RSI);
    save<diy::Bounds<int>>(in_RSI,x,(size_t)n);
  }
  return;
}

Assistant:

static void         save(BinaryBuffer& bb, const Vector& v)
    {
      size_t s = v.size();
      diy::save(bb, s);
      if (s > 0)
        diy::save(bb, &v[0], v.size());
    }